

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O0

void juzzlin::StreamTest::testTimestampMode_epochMicroseconds_shouldPrintEpochMicrosecondsTimestamp
               (string *message)

{
  bool bVar1;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *this;
  long lVar2;
  string *in_RDI;
  regex epochMicrosecondsRegex;
  stringstream ss;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  flag_type in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe30;
  string local_1c8 [32];
  SimpleLogger local_1a8 [24];
  stringstream local_190 [16];
  ostream local_180 [376];
  string *local_8;
  
  local_8 = in_RDI;
  juzzlin::SimpleLogger::setTimestampMode(EpochMicroseconds);
  std::__cxx11::stringstream::stringstream(local_190);
  juzzlin::SimpleLogger::setStream(Info,local_180);
  juzzlin::SimpleLogger::SimpleLogger(local_1a8);
  this = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
         juzzlin::SimpleLogger::info_abi_cxx11_();
  std::operator<<((ostream *)this,local_8);
  juzzlin::SimpleLogger::~SimpleLogger(local_1a8);
  std::__cxx11::stringstream::str();
  lVar2 = std::__cxx11::string::find(local_1c8,(ulong)local_8);
  if (lVar2 == -1) {
    __assert_fail("ss.str().find(message) != std::string::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]SimpleLogger/src/tests/stream_test/stream_test.cpp"
                  ,300,
                  "void juzzlin::StreamTest::testTimestampMode_epochMicroseconds_shouldPrintEpochMicrosecondsTimestamp(const std::string &)"
                 );
  }
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
  std::__cxx11::stringstream::str();
  bVar1 = std::
          regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                     (match_flag_type)((ulong)this >> 0x20));
  if (!bVar1) {
    __assert_fail("std::regex_search(ss.str(), epochMicrosecondsRegex)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]SimpleLogger/src/tests/stream_test/stream_test.cpp"
                  ,0x130,
                  "void juzzlin::StreamTest::testTimestampMode_epochMicroseconds_shouldPrintEpochMicrosecondsTimestamp(const std::string &)"
                 );
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(this);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

void testTimestampMode_epochMicroseconds_shouldPrintEpochMicrosecondsTimestamp(const std::string & message)
{
    L::setTimestampMode(L::TimestampMode::EpochMicroseconds);
    std::stringstream ss;
    L::setStream(L::Level::Info, ss);
    L().info() << message;
    assert(ss.str().find(message) != std::string::npos);

    // Regex to match epoch microseconds format
    const std::regex epochMicrosecondsRegex(R"(\d{16} ##)");
    assert(std::regex_search(ss.str(), epochMicrosecondsRegex));
}